

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<EnumDef>::emplace<EnumDef_const&>
          (QMovableArrayOps<EnumDef> *this,qsizetype i,EnumDef *args)

{
  EnumDef **ppEVar1;
  qsizetype *pqVar2;
  EnumDef *pEVar3;
  Int IVar4;
  Data *pDVar5;
  EnumDef *pEVar6;
  Data *pDVar7;
  char *pcVar8;
  qsizetype qVar9;
  Data *pDVar10;
  char *pcVar11;
  qsizetype qVar12;
  Data *pDVar13;
  char *pcVar14;
  qsizetype qVar15;
  Data *pDVar16;
  long in_FS_OFFSET;
  bool bVar17;
  QArrayDataPointer<QByteArray> local_58;
  Int IStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0011150f:
    pDVar7 = (args->name).d.d;
    pcVar8 = (args->name).d.ptr;
    qVar9 = (args->name).d.size;
    if (pDVar7 != (Data *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    pDVar10 = (args->enumName).d.d;
    pcVar11 = (args->enumName).d.ptr;
    qVar12 = (args->enumName).d.size;
    if (pDVar10 != (Data *)0x0) {
      LOCK();
      (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pDVar13 = (args->type).d.d;
    pcVar14 = (args->type).d.ptr;
    qVar15 = (args->type).d.size;
    if (pDVar13 != (Data *)0x0) {
      LOCK();
      (pDVar13->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar13->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58.d = (args->values).d.d;
    local_58.ptr = (args->values).d.ptr;
    local_58.size = (args->values).d.size;
    if (local_58.d != (Data *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    IVar4 = (args->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
            super_QFlagsStorage<QtMocConstants::EnumFlags>.i;
    _IStack_40 = CONCAT44(0xaaaaaaaa,IVar4);
    bVar17 = (this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.size != 0;
    QArrayDataPointer<EnumDef>::detachAndGrow
              ((QArrayDataPointer<EnumDef> *)this,(uint)(i == 0 && bVar17),1,(EnumDef **)0x0,
               (QArrayDataPointer<EnumDef> *)0x0);
    pEVar6 = (this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.ptr;
    if (i == 0 && bVar17) {
      pEVar6[-1].name.d.d = pDVar7;
      pEVar6[-1].name.d.ptr = pcVar8;
      pEVar6[-1].name.d.size = qVar9;
      pEVar6[-1].enumName.d.d = pDVar10;
      pEVar6[-1].enumName.d.ptr = pcVar11;
      pEVar6[-1].enumName.d.size = qVar12;
      pEVar6[-1].type.d.d = pDVar13;
      pEVar6[-1].type.d.ptr = pcVar14;
      pEVar6[-1].type.d.size = qVar15;
      pEVar6[-1].values.d.d = local_58.d;
      pEVar6[-1].values.d.ptr = local_58.ptr;
      pEVar6[-1].values.d.size = local_58.size;
      pEVar6[-1].flags.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
      super_QFlagsStorage<QtMocConstants::EnumFlags>.i = IVar4;
      ppEVar1 = &(this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.ptr;
      *ppEVar1 = *ppEVar1 + -1;
    }
    else {
      pEVar3 = pEVar6 + i;
      memmove(pEVar3 + 1,pEVar6 + i,
              ((this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.size - i) *
              0x68);
      (pEVar3->name).d.d = pDVar7;
      (pEVar3->name).d.ptr = pcVar8;
      (pEVar3->name).d.size = qVar9;
      (pEVar3->enumName).d.d = pDVar10;
      (pEVar3->enumName).d.ptr = pcVar11;
      (pEVar3->enumName).d.size = qVar12;
      (pEVar3->type).d.d = pDVar13;
      (pEVar3->type).d.ptr = pcVar14;
      (pEVar3->type).d.size = qVar15;
      (pEVar3->values).d.d = local_58.d;
      (pEVar3->values).d.ptr = local_58.ptr;
      (pEVar3->values).d.size = local_58.size;
      (pEVar3->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
      super_QFlagsStorage<QtMocConstants::EnumFlags>.i = IVar4;
    }
    local_58.size = 0;
    local_58.ptr = (QByteArray *)0x0;
    local_58.d = (Data *)0x0;
    pqVar2 = &(this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.size;
    *pqVar2 = *pqVar2 + 1;
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_58);
  }
  else {
    if (((this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.size == i) &&
       (pEVar6 = (this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.ptr,
       (pDVar5->super_QArrayData).alloc - i !=
       ((long)((long)pEVar6 -
              ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       0x4ec4ec4ec4ec4ec5)) {
      pDVar7 = (args->name).d.d;
      pEVar6[i].name.d.d = pDVar7;
      pEVar6[i].name.d.ptr = (args->name).d.ptr;
      pEVar6[i].name.d.size = (args->name).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar7 = (args->enumName).d.d;
      pEVar6[i].enumName.d.d = pDVar7;
      pEVar6[i].enumName.d.ptr = (args->enumName).d.ptr;
      pEVar6[i].enumName.d.size = (args->enumName).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar7 = (args->type).d.d;
      pEVar6[i].type.d.d = pDVar7;
      pEVar6[i].type.d.ptr = (args->type).d.ptr;
      pEVar6[i].type.d.size = (args->type).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar16 = (args->values).d.d;
      pEVar6[i].values.d.d = pDVar16;
      pEVar6[i].values.d.ptr = (args->values).d.ptr;
      pEVar6[i].values.d.size = (args->values).d.size;
      if (pDVar16 != (Data *)0x0) {
        LOCK();
        (pDVar16->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar16->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pEVar6[i].flags.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
      super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
           (args->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
           super_QFlagsStorage<QtMocConstants::EnumFlags>.i;
    }
    else {
      if ((i != 0) ||
         (pEVar6 = (this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.ptr,
         (EnumDef *)((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
         pEVar6)) goto LAB_0011150f;
      pDVar7 = (args->name).d.d;
      pEVar6[-1].name.d.d = pDVar7;
      pEVar6[-1].name.d.ptr = (args->name).d.ptr;
      pEVar6[-1].name.d.size = (args->name).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar7 = (args->enumName).d.d;
      pEVar6[-1].enumName.d.d = pDVar7;
      pEVar6[-1].enumName.d.ptr = (args->enumName).d.ptr;
      pEVar6[-1].enumName.d.size = (args->enumName).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar7 = (args->type).d.d;
      pEVar6[-1].type.d.d = pDVar7;
      pEVar6[-1].type.d.ptr = (args->type).d.ptr;
      pEVar6[-1].type.d.size = (args->type).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar16 = (args->values).d.d;
      pEVar6[-1].values.d.d = pDVar16;
      pEVar6[-1].values.d.ptr = (args->values).d.ptr;
      pEVar6[-1].values.d.size = (args->values).d.size;
      if (pDVar16 != (Data *)0x0) {
        LOCK();
        (pDVar16->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar16->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pEVar6[-1].flags.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
      super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
           (args->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
           super_QFlagsStorage<QtMocConstants::EnumFlags>.i;
      ppEVar1 = &(this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.ptr;
      *ppEVar1 = *ppEVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }